

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

DP_WSR_Stream
MpiInitWriterPerReader
          (CP_Services Svcs,DP_WS_Stream WS_Stream_v,int readerCohortSize,CP_PeerCohort PeerCohort,
          void **providedReaderInfo_v,void **WriterContactInfoPtr)

{
  int *piVar1;
  void *pvVar2;
  int *rank;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  long *in_R9;
  SMPI_Comm comm;
  int Rank;
  int i;
  MpiReaderContactInfo *providedReaderInfo;
  MpiStreamWPR StreamWPR;
  MpiStreamWR StreamWR;
  uint in_stack_ffffffffffffffb0;
  int iVar3;
  
  piVar1 = (int *)calloc(0x490,1);
  MPI_Open_port(&ompi_mpi_info_null,piVar1 + 0x20);
  *(undefined8 **)(piVar1 + 6) = in_RSI;
  *(undefined8 *)(piVar1 + 2) = in_RCX;
  *piVar1 = in_EDX;
  (*(code *)*in_RDI)(*in_RSI,5,"MPI dataplane WriterPerReader to be initialized\n");
  pvVar2 = malloc((long)in_EDX * 0x48);
  *(void **)(piVar1 + 0x1c) = pvVar2;
  pvVar2 = malloc((long)in_EDX << 3);
  *(void **)(piVar1 + 0x1e) = pvVar2;
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    memcpy((void *)(*(long *)(piVar1 + 0x1c) + (long)iVar3 * 0x48),
           *(void **)(in_R8 + (long)iVar3 * 8),0x48);
    *(undefined **)(*(long *)(piVar1 + 0x1e) + (long)iVar3 * 8) = &ompi_mpi_comm_null;
  }
  pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0xf));
  piVar1[0x120] = 0;
  piVar1[0x121] = 0;
  *(undefined8 *)(piVar1 + 0x122) = in_RSI[7];
  *(int **)in_RSI[7] = piVar1;
  in_RSI[7] = piVar1 + 0x120;
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0xf));
  rank = (int *)(*(code *)in_RDI[3])(*in_RSI);
  SMPI_Comm_rank((SMPI_Comm)CONCAT44(iVar3,in_stack_ffffffffffffffb0),rank);
  snprintf((char *)(piVar1 + 8),0x40,"Writer Rank %d, test contact",(ulong)in_stack_ffffffffffffffb0
          );
  *(int **)(piVar1 + 0x18) = piVar1;
  *(undefined8 *)(piVar1 + 0x1a) = in_RSI[2];
  *in_R9 = (long)(piVar1 + 8);
  return piVar1;
}

Assistant:

static DP_WSR_Stream MpiInitWriterPerReader(CP_Services Svcs, DP_WS_Stream WS_Stream_v,
                                            int readerCohortSize, CP_PeerCohort PeerCohort,
                                            void **providedReaderInfo_v,
                                            void **WriterContactInfoPtr)
{
    MpiStreamWR StreamWR = (MpiStreamWR)WS_Stream_v;
    MpiStreamWPR StreamWPR = calloc(sizeof(struct _MpiStreamWPR), 1);
    MpiReaderContactInfo *providedReaderInfo = (MpiReaderContactInfo *)providedReaderInfo_v;

    MPI_Open_port(MPI_INFO_NULL, StreamWPR->MpiPortName);

    StreamWPR->StreamWR = StreamWR; /* pointer to writer struct */
    StreamWPR->Link.PeerCohort = PeerCohort;
    StreamWPR->Link.CohortSize = readerCohortSize;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MPI dataplane WriterPerReader to be initialized\n");

    /* * Copy of writer contact information (original will not be preserved) */
    StreamWPR->CohortReaderInfo = malloc(sizeof(struct _MpiReaderContactInfo) * readerCohortSize);
    StreamWPR->CohortMpiComms = malloc(sizeof(MPI_Comm) * readerCohortSize);
    for (int i = 0; i < readerCohortSize; i++)
    {
        memcpy(&StreamWPR->CohortReaderInfo[i], providedReaderInfo[i],
               sizeof(struct _MpiReaderContactInfo));
        StreamWPR->CohortMpiComms[i] = MPI_COMM_NULL;
    }

    pthread_mutex_lock(&StreamWR->MutexReaders);
    TAILQ_INSERT_TAIL(&StreamWR->Readers, StreamWPR, entries);
    pthread_mutex_unlock(&StreamWR->MutexReaders);

    /* Prepare ContactInfo */
    int Rank;
    SMPI_Comm comm = Svcs->getMPIComm(StreamWR->Stream.CP_Stream);
    SMPI_Comm_rank(comm, &Rank);
    snprintf(StreamWPR->MyContactInfo.ContactString, MPI_DP_CONTACT_STRING_LEN,
             "Writer Rank %d, test contact", Rank);

    StreamWPR->MyContactInfo.StreamWPR = StreamWPR;
    StreamWPR->MyContactInfo.taskID = StreamWR->Stream.taskID;
    *WriterContactInfoPtr = &StreamWPR->MyContactInfo;

    return StreamWPR;
}